

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VtabDisconnect(sqlite3 *db,Table *p)

{
  VTable **ppVVar1;
  VTable *pVVar2;
  VTable *pVTab;
  
  pVTab = p->pVTable;
  if (pVTab == (VTable *)0x0) {
    return;
  }
  if (pVTab->db == db) {
    ppVVar1 = &p->pVTable;
  }
  else {
    do {
      pVVar2 = pVTab;
      pVTab = pVVar2->pNext;
      if (pVTab == (VTable *)0x0) {
        return;
      }
    } while (pVTab->db != db);
    ppVVar1 = &pVVar2->pNext;
  }
  *ppVVar1 = pVTab->pNext;
  sqlite3VtabUnlock(pVTab);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabDisconnect(sqlite3 *db, Table *p){
  VTable **ppVTab;

  assert( IsVirtual(p) );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3_mutex_held(db->mutex) );

  for(ppVTab=&p->pVTable; *ppVTab; ppVTab=&(*ppVTab)->pNext){
    if( (*ppVTab)->db==db  ){
      VTable *pVTab = *ppVTab;
      *ppVTab = pVTab->pNext;
      sqlite3VtabUnlock(pVTab);
      break;
    }
  }
}